

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
InvariantBlockBackwardIterator::UpdatePredBlockBV(InvariantBlockBackwardIterator *this)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar5;
  Type_conflict node;
  Type *ppFVar6;
  BasicBlock *this_02;
  FlowEdge **edge;
  Iterator __iter;
  InvariantBlockBackwardIterator *this_local;
  
  if ((this->followFlow & 1U) != 0) {
    __iter.current = (NodeBase *)this;
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(&this->blockBV);
    if (!bVar2) {
      uVar4 = BasicBlock::GetBlockNum(this->block);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(&this->blockBV,uVar4);
      if (BVar3 == '\0') {
        return false;
      }
    }
    this_01 = &BasicBlock::GetPredList(this->block)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    _edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = edge;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&edge);
      this_02 = FlowEdge::GetPred(*ppFVar6);
      uVar4 = BasicBlock::GetBlockNum(this_02);
      BVSparse<Memory::JitArenaAllocator>::Set(&this->blockBV,uVar4);
    }
  }
  return true;
}

Assistant:

bool
InvariantBlockBackwardIterator::UpdatePredBlockBV()
{
    if (!this->followFlow)
    {
        return true;
    }

    // Track blocks we've visited to ensure that we only iterate over predecessor blocks
    if (!this->blockBV.IsEmpty() && !this->blockBV.Test(this->block->GetBlockNum()))
    {
        return false;
    }

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->block->GetPredList())
    {
        this->blockBV.Set(edge->GetPred()->GetBlockNum());
    } NEXT_SLISTBASECOUNTED_ENTRY;

    return true;
}